

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O2

string * __thiscall
iDynTree::MatrixDynSize::toString_abi_cxx11_(string *__return_storage_ptr__,MatrixDynSize *this)

{
  ostream *poVar1;
  size_t col;
  ulong uVar2;
  size_t row;
  ulong uVar3;
  long lVar4;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < this->m_rows; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; uVar2 < this->m_cols; uVar2 = uVar2 + 1) {
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)((long)this->m_data + uVar2 * 8 + this->m_cols * lVar4));
      std::operator<<(poVar1," ");
    }
    std::endl<char,std::char_traits<char>>(local_1a8);
    lVar4 = lVar4 + 8;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string MatrixDynSize::toString() const
{
    std::stringstream ss;

    for(std::size_t row=0; row < this->rows(); row++ )
    {
        for(std::size_t col=0; col < this->cols(); col++ )
        {
            ss << this->m_data[this->rawIndexRowMajor(row,col)] << " ";
        }
        ss << std::endl;
    }

    return ss.str();
}